

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType * reduce_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *dt)

{
  int iVar1;
  MOJOSHADER_astDataType *pMVar2;
  void *value;
  void *local_20;
  
  if (dt != (MOJOSHADER_astDataType *)0x0) {
    do {
      if (dt->type != MOJOSHADER_AST_DATATYPE_USER) {
        return dt;
      }
      if (((dt->array).base)->type == MOJOSHADER_AST_DATATYPE_NONE) {
        iVar1 = hash_find((ctx->usertypes).hash,(dt->user).name,&local_20);
        if ((iVar1 == 0) || (local_20 == (void *)0x0)) {
          pMVar2 = (MOJOSHADER_astDataType *)0x0;
        }
        else {
          pMVar2 = *(MOJOSHADER_astDataType **)((long)local_20 + 8);
        }
        (dt->array).base = pMVar2;
        if (pMVar2 == (MOJOSHADER_astDataType *)0x0) {
          __assert_fail("user->details != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x74c,
                        "const MOJOSHADER_astDataType *reduce_datatype(Context *, const MOJOSHADER_astDataType *)"
                       );
        }
      }
      dt = (dt->array).base;
    } while (dt != (MOJOSHADER_astDataType *)0x0);
  }
  return dt;
}

Assistant:

static const MOJOSHADER_astDataType *reduce_datatype(Context *ctx, const MOJOSHADER_astDataType *dt)
{
    const MOJOSHADER_astDataType *retval = dt;
    while (retval && retval->type == MOJOSHADER_AST_DATATYPE_USER)
    {
        // !!! FIXME: Ugh, const removal.
        MOJOSHADER_astDataTypeUser *user = (MOJOSHADER_astDataTypeUser *) &retval->user;
        if (user->details->type == MOJOSHADER_AST_DATATYPE_NONE)
        {
            // Take this opportunity to fix up some usertype stubs that were
            //  left over from the parse phase. You HAVE to catch these in the
            //  right scope, so be aggressive about calling reduce_datatype()
            //  as soon as things come into view!
            user->details = get_usertype(ctx, user->name);
            assert(user->details != NULL);
        } // if

        retval = user->details;
    } // while

    return retval;
}